

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

void __thiscall
MockMemoryReportFormatter::report_free_memory
          (MockMemoryReportFormatter *this,TestResult *result,TestMemoryAllocator *allocator,
          char *param_3,char *param_4,size_t param_5)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockActualCall *pMVar3;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70 [2];
  SimpleString local_50;
  TemporaryDefaultNewAllocator local_40;
  TemporaryDefaultNewAllocator tempAlloc;
  size_t param_5_local;
  char *param_4_local;
  char *param_3_local;
  TestMemoryAllocator *allocator_local;
  TestResult *result_local;
  MockMemoryReportFormatter *this_local;
  
  tempAlloc.newAllocator = (TestMemoryAllocator *)param_5;
  TemporaryDefaultNewAllocator::TemporaryDefaultNewAllocator(&local_40,previousNewAllocator);
  SimpleString::SimpleString(&local_50,"formatter");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_70,"report_free_memory");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,local_70);
  SimpleString::SimpleString(&local_80,"result");
  pMVar3 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var,iVar1),&local_80,result);
  SimpleString::SimpleString(&local_90,"TestMemoryAllocator");
  SimpleString::SimpleString(&local_a0,"allocator");
  (*pMVar3->_vptr_MockActualCall[4])(pMVar3,&local_90,&local_a0,allocator);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(local_70);
  SimpleString::~SimpleString(&local_50);
  TemporaryDefaultNewAllocator::~TemporaryDefaultNewAllocator(&local_40);
  return;
}

Assistant:

virtual void report_free_memory(TestResult* result, TestMemoryAllocator* allocator, char* , const char* , size_t ) _override
    {
        TemporaryDefaultNewAllocator tempAlloc(previousNewAllocator);
        mock("formatter").actualCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", allocator);
    }